

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_bounding_box.cpp
# Opt level: O0

int __thiscall ON_ClippingRegion::TransformPoints(ON_ClippingRegion *this,int count,ON_4dPoint *p)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  double dVar8;
  double dVar9;
  double dVar10;
  double dVar11;
  double dVar12;
  double dVar13;
  int iVar14;
  double *pdVar15;
  double *pdVar16;
  double dVar17;
  double dVar18;
  double dVar19;
  double dVar20;
  double dVar21;
  double clip_plane_tolerance;
  int j;
  int i;
  uint cpbit;
  uint some_out;
  uint all_out;
  uint out;
  double w;
  double z;
  double y;
  double x;
  double *cv;
  ON_PlaneEquation *cpeqn;
  double *xform;
  ON_4dPoint *p_local;
  int count_local;
  ON_ClippingRegion *this_local;
  
  dVar17 = ClipPlaneTolerance(this);
  i = 0;
  cpbit = 0xffffffff;
  clip_plane_tolerance._4_4_ = count;
  x = (double)p;
  do {
    iVar14 = clip_plane_tolerance._4_4_ + -1;
    if (clip_plane_tolerance._4_4_ == 0) goto LAB_0051530d;
    some_out = 0;
    if (this->m_clip_plane_count != 0) {
      j = 0x40;
      cv = (double *)&this->field_0x110;
      clip_plane_tolerance._0_4_ = this->m_clip_plane_count;
      while (clip_plane_tolerance._0_4_ != 0) {
        if (cv[3] * *(double *)((long)x + 0x18) +
            cv[2] * *(double *)((long)x + 0x10) +
            *cv * *(double *)x + cv[1] * *(double *)((long)x + 8) < -dVar17) {
          some_out = j | some_out;
        }
        j = j << 1;
        cv = cv + 4;
        clip_plane_tolerance._0_4_ = clip_plane_tolerance._0_4_ + -1;
      }
    }
    dVar18 = (this->m_xform).m_xform[3][3] * *(double *)((long)x + 0x18) +
             (this->m_xform).m_xform[3][2] * *(double *)((long)x + 0x10) +
             (this->m_xform).m_xform[3][0] * *(double *)x +
             (this->m_xform).m_xform[3][1] * *(double *)((long)x + 8);
    dVar19 = (this->m_xform).m_xform[0][3] * *(double *)((long)x + 0x18) +
             (this->m_xform).m_xform[0][2] * *(double *)((long)x + 0x10) +
             (this->m_xform).m_xform[0][0] * *(double *)x +
             (this->m_xform).m_xform[0][1] * *(double *)((long)x + 8);
    if (-dVar18 <= dVar19) {
      if (dVar18 < dVar19) {
        some_out = some_out | 2;
      }
    }
    else {
      some_out = some_out | 1;
    }
    dVar20 = (this->m_xform).m_xform[1][3] * *(double *)((long)x + 0x18) +
             (this->m_xform).m_xform[1][2] * *(double *)((long)x + 0x10) +
             (this->m_xform).m_xform[1][0] * *(double *)x +
             (this->m_xform).m_xform[1][1] * *(double *)((long)x + 8);
    if (-dVar18 <= dVar20) {
      if (dVar18 < dVar20) {
        some_out = some_out | 8;
      }
    }
    else {
      some_out = some_out | 4;
    }
    dVar21 = (this->m_xform).m_xform[2][3] * *(double *)((long)x + 0x18) +
             (this->m_xform).m_xform[2][2] * *(double *)((long)x + 0x10) +
             (this->m_xform).m_xform[2][0] * *(double *)x +
             (this->m_xform).m_xform[2][1] * *(double *)((long)x + 8);
    if (-dVar18 <= dVar21) {
      if (dVar18 < dVar21) {
        some_out = some_out | 0x20;
      }
    }
    else {
      some_out = some_out | 0x10;
    }
    *(double *)x = dVar19;
    *(double *)((long)x + 8) = dVar20;
    pdVar15 = (double *)((long)x + 0x18);
    *(double *)((long)x + 0x10) = dVar21;
    x = (double)((long)x + 0x20);
    *pdVar15 = dVar18;
    i = some_out | i;
    cpbit = some_out & cpbit;
    clip_plane_tolerance._4_4_ = iVar14;
  } while ((i == 0) || (cpbit != 0));
  while (clip_plane_tolerance._4_4_ != 0) {
    dVar17 = (this->m_xform).m_xform[1][0];
    dVar18 = *(double *)x;
    dVar19 = (this->m_xform).m_xform[1][1];
    dVar20 = (this->m_xform).m_xform[1][2];
    dVar21 = (this->m_xform).m_xform[1][3];
    dVar1 = (this->m_xform).m_xform[2][0];
    dVar2 = *(double *)x;
    dVar3 = (this->m_xform).m_xform[2][1];
    dVar4 = *(double *)((long)x + 8);
    dVar5 = (this->m_xform).m_xform[2][2];
    dVar6 = (this->m_xform).m_xform[2][3];
    dVar7 = (this->m_xform).m_xform[3][0];
    dVar8 = *(double *)x;
    dVar9 = (this->m_xform).m_xform[3][1];
    dVar10 = *(double *)((long)x + 8);
    dVar11 = (this->m_xform).m_xform[3][2];
    dVar12 = *(double *)((long)x + 0x10);
    dVar13 = (this->m_xform).m_xform[3][3];
    pdVar15 = (double *)((long)x + 0x18);
    *(double *)x = (this->m_xform).m_xform[0][3] * *(double *)((long)x + 0x18) +
                   (this->m_xform).m_xform[0][2] * *(double *)((long)x + 0x10) +
                   (this->m_xform).m_xform[0][0] * *(double *)x +
                   (this->m_xform).m_xform[0][1] * *(double *)((long)x + 8);
    *(double *)((long)x + 8) =
         dVar21 * *(double *)((long)x + 0x18) +
         dVar20 * *(double *)((long)x + 0x10) + dVar17 * dVar18 + dVar19 * *(double *)((long)x + 8);
    pdVar16 = (double *)((long)x + 0x18);
    *(double *)((long)x + 0x10) =
         dVar6 * *(double *)((long)x + 0x18) +
         dVar5 * *(double *)((long)x + 0x10) + dVar1 * dVar2 + dVar3 * dVar4;
    x = (double)((long)x + 0x20);
    *pdVar16 = dVar13 * *pdVar15 + dVar11 * dVar12 + dVar7 * dVar8 + dVar9 * dVar10;
    clip_plane_tolerance._4_4_ = clip_plane_tolerance._4_4_ + -1;
  }
LAB_0051530d:
  if (cpbit == 0) {
    if (i == 0) {
      clip_plane_tolerance._4_4_ = 2;
    }
    else {
      clip_plane_tolerance._4_4_ = 1;
    }
  }
  else {
    clip_plane_tolerance._4_4_ = 0;
  }
  return clip_plane_tolerance._4_4_;
}

Assistant:

int ON_ClippingRegion::TransformPoints( int count, ON_4dPoint* p ) const
{
  // transforms cv's to pick coordinates
  const double* xform;
  const ON_PlaneEquation* cpeqn;
  double* cv;
  double x, y, z, w;
  unsigned int out, all_out, some_out, cpbit;
  int i, j;
  
  // 14 May 2012 Dale Lear
  //   Fix http://dev.mcneel.com/bugtrack/?q=102481
  //   Picking hatches that are coplanar with clipping planes.
  //   The "fix" was to set clipping_plane_tolerance = same
  //   tolerance the display code uses.  Before the fix,
  //   0.0 was used as the clipping_plane_tolerance.
  const double clip_plane_tolerance = ClipPlaneTolerance();

  some_out = 0;
  all_out  = 0xFFFFFFFF;
  xform = &m_xform.m_xform[0][0];
  cv = &p[0].x;
  i = count;
  while (i--) 
  {
    out = 0;
    if ( m_clip_plane_count )
    {
      cpbit = 0x40;
      cpeqn = m_clip_plane;
      j = m_clip_plane_count;
      while (j--)
      {
        x = cpeqn->x*cv[0] + cpeqn->y*cv[1] + cpeqn->z*cv[2] + cpeqn->d*cv[3];
        if ( x < -clip_plane_tolerance )
          out |= cpbit;
        cpbit <<= 1;
        cpeqn++;
      }
    }
    w = xform[12]*cv[0] + xform[13]*cv[1] + xform[14]*cv[2] + xform[15]*cv[3];
    x = xform[0]*cv[0] + xform[1]*cv[1] + xform[2]*cv[2] + xform[3]*cv[3];
    if (x < -w) out |= 0x01; else if (x > w) out |= 0x02;
    y = xform[4]*cv[0] + xform[5]*cv[1] + xform[6]*cv[2] + xform[7]*cv[3];
    if (y < -w) out |= 0x04; else if (y > w) out |= 0x08;
    z = xform[8]*cv[0] + xform[9]*cv[1] + xform[10]*cv[2] + xform[11]*cv[3];
    if (z < -w) out |= 0x10; else if (z > w) out |= 0x20;
    *cv++ = x; *cv++ = y; *cv++ = z; *cv++ = w;
    some_out |= out;
    all_out  &= out;
    if ( some_out && !all_out )
    {
      //  no further "out" checking is necessary
      while (i--)
      {
        x = xform[0]*cv[0] + xform[1]*cv[1] + xform[2]*cv[2] + xform[3]*cv[3];
        y = xform[4]*cv[0] + xform[5]*cv[1] + xform[6]*cv[2] + xform[7]*cv[3];
        z = xform[8]*cv[0] + xform[9]*cv[1] + xform[10]*cv[2] + xform[11]*cv[3];
        w = xform[12]*cv[0] + xform[13]*cv[1] + xform[14]*cv[2] + xform[15]*cv[3];
        *cv++ = x; *cv++ = y; *cv++ = z; *cv++ = w;
      }
      break;
    }
  }

  if ( all_out )
    i = 0;
  else if ( some_out )
    i = 1;
  else
    i = 2;

  return i;
}